

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  RepeatedFieldAccessor *pRVar4;
  undefined1 *puVar5;
  FieldDescriptor *local_90;
  LogMessage local_88;
  LogMessage local_50;
  
  if (((byte)field[1] & 0x60) != 0x60) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x155);
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_88._0_8_ = FieldDescriptor::TypeOnceInit;
    local_90 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_88,&local_90)
    ;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 8:
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    return (RepeatedFieldAccessor *)
           &anon_unknown_0::
            GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>_>::
            singleton;
  case 2:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::singleton
        != '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::singleton =
         &PTR_IsEmpty_004e3dd8;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    break;
  case 3:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()::
        singleton != '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()::
    singleton = &PTR_IsEmpty_004e3d08;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    break;
  case 4:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()::
        singleton != '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()::
    singleton = &PTR_IsEmpty_004e3ea8;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    break;
  case 5:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
        singleton != '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::singleton =
         &PTR_IsEmpty_004e4048;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    break;
  case 6:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::singleton
        != '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::singleton =
         &PTR_IsEmpty_004e3f78;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    break;
  case 7:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::singleton
        != '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::singleton =
         &PTR_IsEmpty_004e4118;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    break;
  case 9:
    pRVar4 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton !=
        '\0') {
      return pRVar4;
    }
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()
                                 ::singleton);
    if (iVar2 == 0) {
      return pRVar4;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton =
         &PTR_IsEmpty_004e41e8;
    puVar5 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    break;
  case 10:
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_88._0_8_ = FieldDescriptor::TypeOnceInit;
      local_90 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_88,
                 &local_90);
    }
    if ((field[2] == (FieldDescriptor)0xb) &&
       (bVar1 = FieldDescriptor::is_map_message_type(field), bVar1)) {
      pRVar4 = (RepeatedFieldAccessor *)
               &(anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()
                ::singleton;
      if ((anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
          singleton != '\0') {
        return pRVar4;
      }
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
                                   singleton);
      if (iVar2 == 0) {
        return pRVar4;
      }
      (anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton
           = &PTR_IsEmpty_004e42c0;
      puVar5 = &(anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()
                ::singleton;
    }
    else {
      pRVar4 = (RepeatedFieldAccessor *)
               &(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
      if ((anonymous_namespace)::
          GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton !=
          '\0') {
        return pRVar4;
      }
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()
                                   ::singleton);
      if (iVar2 == 0) {
        return pRVar4;
      }
      (anonymous_namespace)::
      GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton =
           &PTR_IsEmpty_004e4390;
      puVar5 = &(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x171);
    pLVar3 = internal::LogMessage::operator<<(&local_88,"Should not reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar3);
    internal::LogMessage::~LogMessage(&local_88);
    return (RepeatedFieldAccessor *)0x0;
  }
  __cxa_guard_release(puVar5);
  return pRVar4;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32_t)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t)
    HANDLE_PRIMITIVE_TYPE(INT64, int64_t)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32_t)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->options().ctype()) {
        default:
        case FieldOptions::STRING:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  GOOGLE_LOG(FATAL) << "Should not reach here.";
  return nullptr;
}